

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceTests.cpp
# Opt level: O2

int testMultiFunctionAllowed(void)

{
  ulong uVar1;
  bool bVar2;
  ResultType RVar3;
  ModelDescription *interface;
  FunctionDescription *pFVar4;
  ostream *poVar5;
  undefined8 *puVar6;
  int iVar7;
  char *pcVar8;
  ValidationPolicy local_6c;
  undefined1 local_68 [40];
  Model m;
  
  CoreML::Specification::Model::Model(&m);
  local_6c.allowsEmptyInput = true;
  local_6c.allowsEmptyOutput = true;
  local_6c.allowsMultipleFunctions = true;
  local_6c.allowsStatefulPrediction = false;
  interface = CoreML::Specification::Model::_internal_mutable_description(&m);
  uVar1 = (interface->super_MessageLite)._internal_metadata_.ptr_;
  puVar6 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar6 = (undefined8 *)*puVar6;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            (&interface->defaultfunctionname_,"foo",puVar6);
  pFVar4 = google::protobuf::RepeatedPtrField<CoreML::Specification::FunctionDescription>::Add
                     (&interface->functions_);
  uVar1 = (pFVar4->super_MessageLite)._internal_metadata_.ptr_;
  puVar6 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar6 = (undefined8 *)*puVar6;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar4->name_,"foo",puVar6);
  CoreML::validateModelDescription((Result *)local_68,interface,9,&local_6c);
  bVar2 = CoreML::Result::good((Result *)local_68);
  std::__cxx11::string::~string((string *)(local_68 + 8));
  if (bVar2) {
    local_6c.allowsMultipleFunctions = false;
    CoreML::validateModelDescription((Result *)local_68,interface,9,&local_6c);
    bVar2 = CoreML::Result::good((Result *)local_68);
    std::__cxx11::string::~string((string *)(local_68 + 8));
    if (bVar2) {
      poVar5 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                              );
      poVar5 = std::operator<<(poVar5,":");
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x18b);
      poVar5 = std::operator<<(poVar5,": error: ");
      pcVar8 = 
      "!(((validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy))).good())"
      ;
    }
    else {
      CoreML::validateModelDescription((Result *)local_68,interface,9,&local_6c);
      RVar3 = CoreML::Result::type((Result *)local_68);
      std::__cxx11::string::~string((string *)(local_68 + 8));
      iVar7 = 0;
      if (RVar3 == MODEL_TYPE_DOES_NOT_SUPPORT_MULTI_FUNCTION) goto LAB_00139105;
      poVar5 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                              );
      poVar5 = std::operator<<(poVar5,":");
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x18b);
      poVar5 = std::operator<<(poVar5,": error: ");
      pcVar8 = 
      "((ResultType::MODEL_TYPE_DOES_NOT_SUPPORT_MULTI_FUNCTION)) == ((validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy)).type())"
      ;
    }
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x188);
    poVar5 = std::operator<<(poVar5,": error: ");
    pcVar8 = 
    "(validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy)).good()"
    ;
  }
  poVar5 = std::operator<<(poVar5,pcVar8);
  poVar5 = std::operator<<(poVar5," was false, expected true.");
  std::endl<char,std::char_traits<char>>(poVar5);
  iVar7 = 1;
LAB_00139105:
  CoreML::Specification::Model::~Model(&m);
  return iVar7;
}

Assistant:

int testMultiFunctionAllowed() {
    Specification::Model m;

    auto validationPolicy = ValidationPolicy();
    validationPolicy.allowsEmptyInput = true;
    validationPolicy.allowsEmptyOutput = true;
    validationPolicy.allowsMultipleFunctions = true;

    auto *description = m.mutable_description();
    description->set_defaultfunctionname("foo");
    auto *function = description->add_functions();
    function->set_name("foo");

    ML_ASSERT_GOOD(validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy));

    validationPolicy.allowsMultipleFunctions = false;
    ML_ASSERT_BAD_WITH_TYPE(validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy), ResultType::MODEL_TYPE_DOES_NOT_SUPPORT_MULTI_FUNCTION);

    return 0;
}